

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.cc
# Opt level: O1

void * __thiscall
tcmalloc::ThreadCache::FetchFromCentralCache
          (ThreadCache *this,uint32_t cl,int32_t byte_size,_func_void_ptr_size_t *oom_handler)

{
  FreeList *pFVar1;
  uint32_t N;
  uint uVar2;
  void *pvVar3;
  ulong uVar4;
  int iVar5;
  uint32_t uVar6;
  long *local_40;
  void *end;
  void *start;
  
  uVar4 = (ulong)cl;
  uVar6 = (&DAT_0012e644)[uVar4];
  N = this->list_[uVar4].max_length_;
  if ((int)uVar6 < (int)N) {
    N = uVar6;
  }
  pFVar1 = this->list_ + uVar4;
  iVar5 = CentralFreeList::RemoveRange
                    ((CentralFreeList *)(&Static::central_cache_ + uVar4 * 0x130),&end,&local_40,N);
  if (iVar5 == 0) {
    end = (*oom_handler)((long)byte_size);
  }
  else {
    if (0 < iVar5) {
      this->size_ = this->size_ + byte_size * (iVar5 + -1);
      pvVar3 = *end;
      if (pvVar3 != (void *)0x0) {
        *local_40 = (long)pFVar1->list_;
        pFVar1->list_ = pvVar3;
      }
      pFVar1->length_ = pFVar1->length_ + iVar5 + -1;
    }
    uVar2 = pFVar1->max_length_;
    if ((ulong)uVar2 < (ulong)(long)(int)uVar6) {
      uVar6 = uVar2 + 1;
    }
    else {
      iVar5 = 0x2000;
      if ((int)(uVar2 + uVar6) < 0x2000) {
        iVar5 = uVar2 + uVar6;
      }
      uVar6 = iVar5 - iVar5 % (int)uVar6;
    }
    pFVar1->max_length_ = uVar6;
  }
  return end;
}

Assistant:

void* ThreadCache::FetchFromCentralCache(uint32_t cl, int32_t byte_size,
                                         void *(*oom_handler)(size_t size)) {
  FreeList* list = &list_[cl];
  ASSERT(list->empty());
  const int batch_size = Static::sizemap()->num_objects_to_move(cl);

  const int num_to_move = std::min<int>(list->max_length(), batch_size);
  void *start, *end;
  int fetch_count = Static::central_cache()[cl].RemoveRange(
      &start, &end, num_to_move);

  if (fetch_count == 0) {
    ASSERT(start == nullptr);
    return oom_handler(byte_size);
  }
  ASSERT(start != nullptr);

  if (--fetch_count >= 0) {
    size_ += byte_size * fetch_count;
    list->PushRange(fetch_count, SLL_Next(start), end);
  }

  // Increase max length slowly up to batch_size.  After that,
  // increase by batch_size in one shot so that the length is a
  // multiple of batch_size.
  if (list->max_length() < batch_size) {
    list->set_max_length(list->max_length() + 1);
  } else {
    // Don't let the list get too long.  In 32 bit builds, the length
    // is represented by a 16 bit int, so we need to watch out for
    // integer overflow.
    int new_length = std::min<int>(list->max_length() + batch_size,
                              kMaxDynamicFreeListLength);
    // The list's max_length must always be a multiple of batch_size,
    // and kMaxDynamicFreeListLength is not necessarily a multiple
    // of batch_size.
    new_length -= new_length % batch_size;
    ASSERT(new_length % batch_size == 0);
    list->set_max_length(new_length);
  }
  return start;
}